

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

_Bool Hacl_P256_ecdsa_sign_p256_sha384
                (uint8_t *signature,uint32_t msg_len,uint8_t *msg,uint8_t *private_key,
                uint8_t *nonce)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t t1;
  ulong uVar8;
  uint8_t mHash [48];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  Hacl_Hash_SHA2_hash_384((uint8_t *)&local_68,msg,msg_len);
  uVar8 = uStack_50 >> 0x38 | (uStack_50 & 0xff000000000000) >> 0x28 |
          (uStack_50 & 0xff0000000000) >> 0x18 | (uStack_50 & 0xff00000000) >> 8 |
          (uStack_50 & 0xff000000) << 8 | (uStack_50 & 0xff0000) << 0x18 |
          (uStack_50 & 0xff00) << 0x28 | uStack_50 << 0x38;
  uVar5 = local_58 >> 0x38 | (local_58 & 0xff000000000000) >> 0x28 |
          (local_58 & 0xff0000000000) >> 0x18 | (local_58 & 0xff00000000) >> 8 |
          (local_58 & 0xff000000) << 8 | (local_58 & 0xff0000) << 0x18 | (local_58 & 0xff00) << 0x28
          | local_58 << 0x38;
  uVar6 = uStack_60 >> 0x38 | (uStack_60 & 0xff000000000000) >> 0x28 |
          (uStack_60 & 0xff0000000000) >> 0x18 | (uStack_60 & 0xff00000000) >> 8 |
          (uStack_60 & 0xff000000) << 8 | (uStack_60 & 0xff0000) << 0x18 |
          (uStack_60 & 0xff00) << 0x28 | uStack_60 << 0x38;
  uVar7 = local_68 >> 0x38 | (local_68 & 0xff000000000000) >> 0x28 |
          (local_68 & 0xff0000000000) >> 0x18 | (local_68 & 0xff00000000) >> 8 |
          (local_68 & 0xff000000) << 8 | (local_68 & 0xff0000) << 0x18 | (local_68 & 0xff00) << 0x28
          | local_68 << 0x38;
  uVar1 = (ulong)(uVar5 < 0xbce6faada7179e84 ||
                 uVar5 + 0x4319055258e8617c < (ulong)(uVar8 < 0xf3b9cac2fc632551));
  uVar2 = (ulong)(uVar6 != 0xffffffffffffffff || uVar6 + 1 < uVar1);
  uVar4 = FStar_UInt64_eq_mask((ulong)(uVar7 < 0xffffffff00000000 || uVar7 + 0x100000000 < uVar2),0)
  ;
  local_88 = (uVar8 + 0xc46353d039cdaaf ^ uVar8) & uVar4 ^ uVar8;
  local_80 = ((uVar5 + 0x4319055258e8617c) - (ulong)(uVar8 < 0xf3b9cac2fc632551) ^ uVar5) & uVar4 ^
             uVar5;
  local_78 = ((uVar6 + 1) - uVar1 ^ uVar6) & uVar4 ^ uVar6;
  local_70 = ((uVar7 + 0x100000000) - uVar2 ^ uVar7) & uVar4 ^ uVar7;
  _Var3 = ecdsa_sign_msg_as_qelem(signature,&local_88,private_key,nonce);
  return _Var3;
}

Assistant:

bool
Hacl_P256_ecdsa_sign_p256_sha384(
  uint8_t *signature,
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *private_key,
  uint8_t *nonce
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[48U] = { 0U };
  Hacl_Hash_SHA2_hash_384(mHash, msg, msg_len);
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_sign_msg_as_qelem(signature, m_q, private_key, nonce);
  return res;
}